

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O3

pcre * __thiscall re2::PCRE::Compile(PCRE *this,Anchor anchor)

{
  string *this_00;
  ostream *poVar1;
  string wrapped;
  undefined1 local_190 [16];
  undefined1 *local_180 [46];
  
  if (anchor == ANCHOR_BOTH) {
    local_190._0_8_ = local_180;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"(?:","");
    std::__cxx11::string::_M_append(local_190,(ulong)(this->pattern_)._M_dataplus._M_p);
    std::__cxx11::string::append(local_190);
    if ((undefined1 **)local_190._0_8_ != local_180) {
      operator_delete((void *)local_190._0_8_);
    }
  }
  if (this->error_ == (string *)empty_string_abi_cxx11_) {
    this_00 = (string *)operator_new(0x20);
    std::__cxx11::string::string((string *)this_00,"",(allocator *)local_190);
    this->error_ = this_00;
  }
  LogMessage::LogMessage
            ((LogMessage *)local_190,
             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/pcre.cc",0xac,2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_190 + 8),"Error compiling \'",0x11);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)(local_190 + 8),(this->pattern_)._M_dataplus._M_p,
                      (this->pattern_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\': ",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"",0);
  LogMessage::~LogMessage((LogMessage *)local_190);
  return (pcre *)0x0;
}

Assistant:

pcre* PCRE::Compile(Anchor anchor) {
  // Special treatment for anchoring.  This is needed because at
  // runtime pcre only provides an option for anchoring at the
  // beginning of a string.
  //
  // There are three types of anchoring we want:
  //    UNANCHORED      Compile the original pattern, and use
  //                    a pcre unanchored match.
  //    ANCHOR_START    Compile the original pattern, and use
  //                    a pcre anchored match.
  //    ANCHOR_BOTH     Tack a "\z" to the end of the original pattern
  //                    and use a pcre anchored match.

  const char* error = "";
  int eoffset;
  pcre* re;
  if (anchor != ANCHOR_BOTH) {
    re = pcre_compile(pattern_.c_str(),
                      (options_ & EnabledCompileOptions),
                      &error, &eoffset, NULL);
  } else {
    // Tack a '\z' at the end of PCRE.  Parenthesize it first so that
    // the '\z' applies to all top-level alternatives in the regexp.
    string wrapped = "(?:";  // A non-counting grouping operator
    wrapped += pattern_;
    wrapped += ")\\z";
    re = pcre_compile(wrapped.c_str(),
                      (options_ & EnabledCompileOptions),
                      &error, &eoffset, NULL);
  }
  if (re == NULL) {
    if (error_ == &empty_string) error_ = new string(error);
    PCREPORT(ERROR) << "Error compiling '" << pattern_ << "': " << error;
  }
  return re;
}